

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O1

void abuf_hexdump(autobuf *out,char *prefix,void *buffer,size_t length)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (length != 0) {
    uVar4 = 0;
    sVar1 = length;
    do {
      uVar2 = 0x20;
      if (sVar1 < 0x20) {
        uVar2 = sVar1;
      }
      abuf_appendf(out,"%s%04zx:",prefix,uVar4);
      uVar3 = length - uVar4;
      if (0x1f < uVar3) {
        uVar3 = 0x20;
      }
      uVar5 = 0;
      do {
        if ((uVar5 & 3) == 0) {
          abuf_puts(out," ");
        }
        if (uVar5 < uVar3) {
          abuf_appendf(out,"%02x",(ulong)*(byte *)((long)buffer + uVar5));
        }
        else {
          abuf_puts(out,"  ");
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x20);
      abuf_puts(out," ");
      uVar3 = 0;
      do {
        if ((byte)(*(char *)((long)buffer + uVar3) - 0x20U) < 0x5f) {
          abuf_appendf(out,"%c");
        }
        else {
          abuf_puts(out,".");
        }
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      abuf_puts(out,"\n");
      uVar4 = uVar4 + 0x20;
      buffer = (void *)((long)buffer + 0x20);
      sVar1 = sVar1 - 0x20;
    } while (uVar4 < length);
  }
  return;
}

Assistant:

void
abuf_hexdump(struct autobuf *out, const char *prefix, const void *buffer, size_t length) {
  const uint8_t *buf;
  size_t j, l;

  buf = buffer;

  for (j = 0; j < length; j += 32) {
    abuf_appendf(out, "%s%04zx:", prefix, j);

    l = length - j;
    if (l > 32) {
      l = 32;
    }
    _print_hexline(out, &buf[j], l);
    abuf_puts(out, "\n");
  }
}